

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

void Gia_ManInsertOne(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew)

{
  Abc_NtkFunc_t AVar1;
  long *plVar2;
  long *plVar3;
  Abc_Obj_t *pAVar4;
  long lVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    __assert_fail("!Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x1fa,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x1fb,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  lVar5 = (long)pNtk->vPis->nSize;
  if (0 < lVar5) {
    lVar10 = 0;
    do {
      plVar2 = *(long **)((long)pNtk->vPis->pArray[lVar10] + 0x40);
      if ((plVar2 != (long *)0x0) && ((Abc_Ntk_t *)*plVar2 != pNew)) {
        __assert_fail("!pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                      ,0x1fe,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      lVar10 = lVar10 + 1;
    } while (lVar5 != lVar10);
  }
  pVVar7 = pNtk->vBoxes;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar5];
      if (0 < *(int *)((long)plVar2 + 0x2c)) {
        lVar10 = 0;
        do {
          if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 9) goto LAB_001d4284;
          if (*(int *)(*(long *)(plVar2[7] + 0x30) + 4) <= lVar10) goto LAB_001d4265;
          plVar3 = *(long **)(*(long *)(*(long *)(*(long *)(plVar2[7] + 0x30) + 8) + lVar10 * 8) +
                             0x40);
          *(long **)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)(plVar2[6] + lVar10 * 4) * 8) + 0x40) = plVar3;
          if ((plVar3 != (long *)0x0) && ((Abc_Ntk_t *)*plVar3 != pNew)) {
            __assert_fail("!pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                          ,0x204,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)plVar2 + 0x2c));
        pVVar7 = pNtk->vBoxes;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar7->nSize);
  }
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar5 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pVVar9->pArray[lVar5];
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        Abc_NtkDeleteObj(pAVar4);
        pVVar9 = pNtk->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar9->nSize);
    pVVar7 = pNtk->vBoxes;
  }
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar5];
      iVar8 = *(int *)((long)plVar2 + 0x1c);
      if (0 < iVar8) {
        lVar10 = 0;
        do {
          pAVar4 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                    (long)*(int *)(plVar2[4] + lVar10 * 4) * 8);
          if ((pAVar4->vFanins).nSize == 0) {
            if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 9) {
LAB_001d4284:
              __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                            ,0x150,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
            }
            if (*(int *)(*(long *)(plVar2[7] + 0x28) + 4) <= lVar10) {
LAB_001d4265:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pAVar6 = Gia_ManInsertOne_rec
                               (pNtk,pNew,
                                *(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*(long *)(plVar2[7] + 0x28) + 8) + lVar10 * 8)
                                 + 0x40));
            Abc_ObjAddFanin(pAVar4,pAVar6);
            iVar8 = *(int *)((long)plVar2 + 0x1c);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar8);
        pVVar7 = pNtk->vBoxes;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vPos;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pVVar7->pArray[lVar5];
      if ((pAVar4->vFanins).nSize == 0) {
        pAVar6 = Gia_ManInsertOne_rec(pNtk,pNew,(pAVar4->field_6).pCopy);
        Abc_ObjAddFanin(pAVar4,pAVar6);
        pVVar7 = pNtk->vPos;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar7->nSize);
  }
  pNtk->pManFunc = pNew->pManFunc;
  AVar1 = pNew->ntkFunc;
  pNtk->ntkFunc = AVar1;
  if (AVar1 == ABC_FUNC_MAP) {
    return;
  }
  __assert_fail("Abc_NtkHasMapping(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x215,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Gia_ManInsertOne( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj, * pBox;  int i, k;
    assert( !Abc_NtkHasMapping(pNtk) );
    assert( Abc_NtkHasMapping(pNew) );
    // check that PIs point to barbufs
    Abc_NtkForEachPi( pNtk, pObj, i )
        assert( !pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew );
    // make barbufs point to box outputs
    Abc_NtkForEachBox( pNtk, pBox, i )
        Abc_ObjForEachFanout( pBox, pObj, k )
        {
            pObj->pCopy = Abc_NtkPo(Abc_ObjModel(pBox), k)->pCopy;
            assert( !pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew );
        }
    // remove internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_NtkDeleteObj( pObj );
    // start traversal from box inputs
    Abc_NtkForEachBox( pNtk, pBox, i )
        Abc_ObjForEachFanin( pBox, pObj, k )
            if ( Abc_ObjFaninNum(pObj) == 0 )
                Abc_ObjAddFanin( pObj, Gia_ManInsertOne_rec(pNtk, pNew, Abc_NtkPi(Abc_ObjModel(pBox), k)->pCopy) );
    // start traversal from primary outputs
    Abc_NtkForEachPo( pNtk, pObj, i )
        if ( Abc_ObjFaninNum(pObj) == 0 )
            Abc_ObjAddFanin( pObj, Gia_ManInsertOne_rec(pNtk, pNew, pObj->pCopy) );
    // update the functionality manager
    pNtk->pManFunc = pNew->pManFunc;
    pNtk->ntkFunc  = pNew->ntkFunc;
    assert( Abc_NtkHasMapping(pNtk) );
}